

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libasd_py.cpp
# Opt level: O3

void add_read_asd(module *mod)

{
  PyObject *pPVar1;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> _Var2;
  long *plVar3;
  handle hVar4;
  cpp_function func;
  unique_function_record unique_rec;
  handle local_68;
  _Head_base<0UL,_pybind11::detail::function_record_*,_false> local_60;
  handle local_58;
  object local_50;
  char *local_48;
  undefined1 local_40;
  long *local_38;
  
  local_48 = "file_name";
  local_40 = 2;
  pPVar1 = (mod->super_object).super_handle.m_ptr;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  plVar3 = (long *)__tls_get_addr(&PTR_0019ddc0);
  *plVar3 = *plVar3 + 1;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"read_raw_data");
  if (local_58.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    *plVar3 = *plVar3 + 1;
    local_58.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  hVar4.m_ptr = local_58.m_ptr;
  local_68.m_ptr = (PyObject *)0x0;
  local_38 = plVar3;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_60);
  _Var2._M_head_impl = local_60._M_head_impl;
  (local_60._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<add_read_asd(pybind11::module_&)::$_0,pybind11::object,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[81]>(add_read_asd(pybind11::module_&)::$_0&&,pybind11::object(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const(&)[81])
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_60._M_head_impl)->nargs_pos = 1;
  (local_60._M_head_impl)->field_0x59 = (local_60._M_head_impl)->field_0x59 & 0x9f;
  (local_60._M_head_impl)->name = "read_raw_data";
  ((local_60._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_60._M_head_impl)->sibling).m_ptr = hVar4.m_ptr;
  pybind11::detail::process_attribute<pybind11::arg,_void>::init
            ((process_attribute<pybind11::arg,_void> *)&local_48,
             (EVP_PKEY_CTX *)local_60._M_head_impl);
  (_Var2._M_head_impl)->doc =
       "This function reads `.asd` file without converting signal to height information.";
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_68,(unique_function_record *)&local_60,"({str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<add_read_asd(pybind11::module_&)::$_0,pybind11::object,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[81]>(add_read_asd(pybind11::module_&)::$_0&&,pybind11::object(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const&[])
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_60);
  pybind11::object::~object((object *)&local_58);
  pybind11::object::~object(&local_50);
  pybind11::module_::add_object(mod,"read_raw_data",local_68,true);
  pybind11::object::~object((object *)&local_68);
  plVar3 = local_38;
  local_48 = "file_name";
  local_40 = 2;
  pPVar1 = (mod->super_object).super_handle.m_ptr;
  *local_38 = *local_38 + 1;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar4.m_ptr = (PyObject *)PyObject_GetAttrString(pPVar1,"read_asd");
  if (hVar4.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    *plVar3 = *plVar3 + 1;
    local_58.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar4.m_ptr = local_58.m_ptr;
  }
  local_58.m_ptr = hVar4.m_ptr;
  hVar4.m_ptr = local_58.m_ptr;
  local_68.m_ptr = (PyObject *)0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_60);
  (local_60._M_head_impl)->impl =
       pybind11::cpp_function::
       initialize<add_read_asd(pybind11::module_&)::$_1,pybind11::object,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[79]>(add_read_asd(pybind11::module_&)::$_1&&,pybind11::object(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const(&)[79])
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  (local_60._M_head_impl)->nargs_pos = 1;
  (local_60._M_head_impl)->field_0x59 = (local_60._M_head_impl)->field_0x59 & 0x9f;
  (local_60._M_head_impl)->name = "read_asd";
  ((local_60._M_head_impl)->scope).m_ptr = pPVar1;
  ((local_60._M_head_impl)->sibling).m_ptr = hVar4.m_ptr;
  pybind11::detail::process_attribute<pybind11::arg,_void>::init
            ((process_attribute<pybind11::arg,_void> *)&local_48,
             (EVP_PKEY_CTX *)local_60._M_head_impl);
  (local_60._M_head_impl)->doc =
       "This function reads `.asd` file after converting signal to height information.";
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)&local_68,(unique_function_record *)&local_60,"({str}) -> %",
             (type_info **)
             pybind11::cpp_function::
             initialize<add_read_asd(pybind11::module_&)::$_1,pybind11::object,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,char[79]>(add_read_asd(pybind11::module_&)::$_1&&,pybind11::object(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::scope_const&,pybind11::sibling_const&,pybind11::arg_const&,char_const&[])
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr((unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                 *)&local_60);
  pybind11::object::~object((object *)&local_58);
  pybind11::object::~object(&local_50);
  pybind11::module_::add_object(mod,"read_asd",local_68,true);
  pybind11::object::~object((object *)&local_68);
  return;
}

Assistant:

void add_read_asd(py::module& mod) // {{{
{
    mod.def("read_raw_data",
        [](const std::string& fname) -> py::object {
            std::ifstream ifs(fname);
            if(!ifs.good())
            {
                throw std::runtime_error("file open error: " + fname);
            }

            const auto v = asd::read_version(ifs);
            switch(v)
            {
                case 0:
                {
                    if(asd::read_header<asd::version<0>>(ifs).data_type_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<1>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<2>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                }
                case 1:
                {
                    if(asd::read_header<asd::version<1>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<1>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<2>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                }
                case 2:
                {
                    if(asd::read_header<asd::version<2>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<1>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<2>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                }
                default: throw std::invalid_argument(
                             "invalid asd version: " + std::to_string(v));
            }
        },
        py::arg("file_name"),
        "This function reads `.asd` file without converting signal "
        "to height information."
        );

    mod.def("read_asd",
        [](const std::string& fname) -> py::object {
            std::ifstream ifs(fname);
            if(!ifs.good())
            {
                throw std::runtime_error("file open error: " + fname);
            }

            const auto v = asd::read_version(ifs);
            switch(v)
            {
                case 0:
                {
                    if(asd::read_header<asd::version<0>>(ifs).data_type_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<1>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<2>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                }
                case 1:
                {
                    if(asd::read_header<asd::version<1>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<1>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<2>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                }
                case 2:
                {
                    if(asd::read_header<asd::version<2>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<1>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<2>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                }
                default: throw std::invalid_argument(
                             "invalid asd version: " + std::to_string(v));
            }
        },
        py::arg("file_name"),
        "This function reads `.asd` file after converting signal "
        "to height information."
        );

    return;
}